

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
ipx::Model::DualizeBasicSolution
          (Model *this,Vector *x_user,Vector *slack_user,Vector *y_user,Vector *z_user,
          Vector *x_solver,Vector *y_solver,Vector *z_solver)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  pointer piVar5;
  double *pdVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  uVar1 = this->num_rows_;
  uVar14 = (ulong)uVar1;
  uVar2 = this->num_cols_;
  lVar15 = (long)(int)uVar2;
  if (this->dualized_ == true) {
    sVar4 = y_solver->_M_size;
    if (sVar4 == x_user->_M_size) {
      if (sVar4 != 0) {
        pdVar6 = y_solver->_M_data;
        pdVar10 = x_user->_M_data;
        sVar8 = 0;
        do {
          pdVar6[sVar8] = -pdVar10[sVar8];
          sVar8 = sVar8 + 1;
        } while (sVar4 != sVar8);
      }
    }
    else {
      if (y_solver->_M_data != (double *)0x0) {
        operator_delete(y_solver->_M_data);
      }
      sVar4 = x_user->_M_size;
      y_solver->_M_size = sVar4;
      pdVar6 = (double *)operator_new(sVar4 << 3);
      y_solver->_M_data = pdVar6;
      sVar4 = y_solver->_M_size;
      if (sVar4 != 0) {
        pdVar10 = x_user->_M_data;
        sVar8 = 0;
        do {
          pdVar6[sVar8] = -pdVar10[sVar8];
          sVar8 = sVar8 + 1;
        } while (sVar4 != sVar8);
      }
    }
    iVar3 = this->num_constr_;
    lVar7 = (long)iVar3;
    if (0 < lVar7) {
      pdVar6 = slack_user->_M_data;
      pdVar10 = z_solver->_M_data;
      lVar9 = 0;
      do {
        pdVar10[lVar9] = -pdVar6[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar7 != lVar9);
    }
    piVar5 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar9 != 0) {
      lVar9 = lVar9 >> 2;
      pdVar6 = (this->c_)._M_data;
      pdVar10 = y_solver->_M_data;
      pdVar12 = z_solver->_M_data;
      lVar13 = 0;
      do {
        pdVar12[lVar7 + lVar13] = pdVar6[iVar3 + (int)lVar13] + pdVar10[piVar5[lVar13]];
        lVar13 = lVar13 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar13);
    }
    if (0 < (int)uVar1) {
      pdVar6 = y_solver->_M_data;
      pdVar10 = (this->c_)._M_data;
      pdVar12 = z_solver->_M_data;
      uVar11 = 0;
      do {
        pdVar12[lVar15 + uVar11] = pdVar10[lVar15 + uVar11] - pdVar6[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
    if (0 < iVar3) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar10 = (double *)y_user->_M_size;
      if (pdVar10 != (double *)0x0) {
        pdVar10 = y_user->_M_data;
      }
      memmove(pdVar6,pdVar10,lVar7 << 3);
    }
    if (0 < (long)this->num_var_) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar10 = (double *)z_user->_M_size;
      if (pdVar10 != (double *)0x0) {
        pdVar10 = z_user->_M_data;
      }
      memmove(pdVar6 + lVar15,pdVar10,(long)this->num_var_ << 3);
    }
    piVar5 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 2;
      pdVar10 = x_solver->_M_data;
      pdVar6 = pdVar10 + this->num_constr_;
      lVar9 = 0;
      do {
        lVar13 = piVar5[lVar9] + lVar15;
        pdVar12 = pdVar6;
        if (pdVar10[lVar13] < 0.0) {
          pdVar12 = pdVar10 + lVar13;
          *pdVar6 = -pdVar10[lVar13];
        }
        *pdVar12 = 0.0;
        lVar9 = lVar9 + 1;
        pdVar6 = pdVar6 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
    }
  }
  else {
    if (0 < (int)uVar2) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar10 = (double *)x_user->_M_size;
      if (pdVar10 != (double *)0x0) {
        pdVar10 = x_user->_M_data;
      }
      memmove(pdVar6,pdVar10,(ulong)uVar2 * 8);
    }
    if (0 < (int)uVar1) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar10 = (double *)slack_user->_M_size;
      if (pdVar10 != (double *)0x0) {
        pdVar10 = slack_user->_M_data;
      }
      memmove(pdVar6 + lVar15,pdVar10,uVar14 * 8);
    }
    if (0 < (int)uVar1) {
      pdVar6 = (double *)y_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = y_solver->_M_data;
      }
      pdVar10 = (double *)y_user->_M_size;
      if (pdVar10 != (double *)0x0) {
        pdVar10 = y_user->_M_data;
      }
      memmove(pdVar6,pdVar10,uVar14 * 8);
    }
    if (0 < (int)uVar2) {
      pdVar6 = (double *)z_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = z_solver->_M_data;
      }
      pdVar10 = (double *)z_user->_M_size;
      if (pdVar10 != (double *)0x0) {
        pdVar10 = z_user->_M_data;
      }
      memmove(pdVar6,pdVar10,lVar15 * 8);
    }
    if (0 < (int)uVar1) {
      pdVar6 = y_solver->_M_data;
      pdVar10 = (this->c_)._M_data;
      pdVar12 = z_solver->_M_data;
      uVar11 = 0;
      do {
        pdVar12[lVar15 + uVar11] = pdVar10[lVar15 + uVar11] - pdVar6[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
  }
  return;
}

Assistant:

void Model::DualizeBasicSolution(const Vector& x_user,
                                 const Vector& slack_user,
                                 const Vector& y_user,
                                 const Vector& z_user,
                                 Vector& x_solver,
                                 Vector& y_solver,
                                 Vector& z_solver) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + boxed_vars_.size() == static_cast<size_t>(n));

        // Build dual solver variables from primal user variables.
        y_solver = -x_user;
        for (Int i = 0; i < num_constr_; i++)
            z_solver[i] = -slack_user[i];
        for (size_t k = 0; k < boxed_vars_.size(); k++) {
            Int j = boxed_vars_[k];
            z_solver[num_constr_+k] = c(num_constr_+k) + y_solver[j];
        }
        for (Int i = 0; i < m; i++)
            z_solver[n+i] = c(n+i)-y_solver[i];

        // Build primal solver variables from dual user variables.
        std::copy_n(std::begin(y_user), num_constr_, std::begin(x_solver));
        std::copy_n(std::begin(z_user), num_var_, std::begin(x_solver) + n);
        for (size_t k = 0; k < boxed_vars_.size(); k++) {
            Int j = boxed_vars_[k];
            if (x_solver[n+j] < 0.0) {
                // j is a boxed variable and z_user[j] < 0
                x_solver[num_constr_+k] = -x_solver[n+j];
                x_solver[n+j] = 0.0;
            } else {
                x_solver[num_constr_+k] = 0.0;
            }
        }
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_user), n, std::begin(x_solver));
        std::copy_n(std::begin(slack_user), m, std::begin(x_solver) + n);
        std::copy_n(std::begin(y_user), m, std::begin(y_solver));
        std::copy_n(std::begin(z_user), n, std::begin(z_solver));
        for (Int i = 0; i < m; i++)
            z_solver[n+i] = c(n+i)-y_solver[i];
    }
}